

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O0

void adapt::cuf::detail::WriteUnsignedInt<double>(ostringstream *str,double *arg,char mod)

{
  exception *this;
  char mod_local;
  double *arg_local;
  ostringstream *str_local;
  
  if (mod == '\0') {
    Write<unsigned_int,double>((ostream *)str,arg);
  }
  else if (mod == '?') {
    WriteAnyUnsignedInt<double>((ostream *)str,*arg);
  }
  else if (mod == 'g') {
    Write<unsigned_char,double>((ostream *)str,arg);
  }
  else if (mod == 'h') {
    Write<unsigned_short,double>((ostream *)str,arg);
  }
  else if (mod == 'l') {
    Write<unsigned_long,double>((ostream *)str,arg);
  }
  else if (mod == 'm') {
    Write<unsigned_long_long,double>((ostream *)str,arg);
  }
  else {
    if (mod != 'z') {
      this = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(this);
      __cxa_throw(this,&std::exception::typeinfo,std::exception::~exception);
    }
    Write<unsigned_long,double>((ostream *)str,arg);
  }
  return;
}

Assistant:

void WriteUnsignedInt(std::ostringstream& str, const Value& arg, char mod)
{
	switch (mod)
	{
	case 'z': Write<std::size_t>(str, arg); break;
	case 'm': Write<unsigned long long>(str, arg); break;
	case 'l': Write<unsigned long>(str, arg); break;
	case 0: Write<unsigned int>(str, arg); break;
	case 'h': Write<unsigned short>(str, arg); break;
	case 'g': Write<unsigned char>(str, arg); break;
	case '?': WriteAnyUnsignedInt(str, arg); break;
	default: throw std::exception(); break;
	}
}